

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void __thiscall
xLearn::RecallMetric::Accumulate
          (RecallMetric *this,vector<float,_std::allocator<float>_> *Y,
          vector<float,_std::allocator<float>_> *pred)

{
  ThreadPool *this_00;
  ThreadPool *pTVar1;
  ostream *poVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  _Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long)>
  *in_RDI;
  size_t i_2;
  size_t i_1;
  size_t end_idx;
  size_t start_idx;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sum_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sum_1;
  allocator_type *in_stack_fffffffffffffde8;
  Logger *in_stack_fffffffffffffdf0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  uint **in_stack_fffffffffffffdf8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe00;
  _Head_base<5UL,_unsigned_long,_false> __args_2;
  vector<float,_std::allocator<float>_> **__args_1;
  vector<float,_std::allocator<float>_> **__args;
  _func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_uint_ptr_uint_ptr_unsigned_long_unsigned_long
  *__f;
  unsigned_long *in_stack_fffffffffffffe30;
  unsigned_long *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  int line;
  string *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  LogSeverity severity;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_150;
  size_type local_148;
  int local_c4;
  undefined1 local_bd [32];
  undefined1 local_9d [37];
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c [3];
  vector<float,_std::allocator<float>_> *local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_1c._4_8_ = in_RDX;
  local_10 = in_RSI;
  this_00 = (ThreadPool *)std::vector<float,_std::allocator<float>_>::size(in_RSI);
  pTVar1 = (ThreadPool *)
           std::vector<float,_std::allocator<float>_>::size
                     ((vector<float,_std::allocator<float>_> *)local_1c._4_8_);
  if (this_00 != pTVar1) {
    Logger::Logger(local_1c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Accumulate",(allocator *)(local_9d + 0x24));
    poVar2 = Logger::Start(severity,in_stack_fffffffffffffe68,line,in_stack_fffffffffffffe58);
    poVar2 = std::operator<<(poVar2,"CHECK_EQ failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x139);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"Y.size()");
    poVar2 = std::operator<<(poVar2," = ");
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"pred.size()");
    poVar2 = std::operator<<(poVar2," = ");
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_1c._4_8_);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)(local_9d + 0x24));
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger(in_stack_fffffffffffffdf0);
    abort();
  }
  __f = (_func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_uint_ptr_uint_ptr_unsigned_long_unsigned_long
         *)(in_RDI->_M_bound_args).
           super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
           .
           super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
           .super__Tuple_impl<2UL,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>.
           super__Tuple_impl<3UL,_unsigned_int_*,_unsigned_long,_unsigned_long>.
           super__Tuple_impl<4UL,_unsigned_long,_unsigned_long>.
           super__Head_base<4UL,_unsigned_long,_false>._M_head_impl;
  local_9d._1_4_ = 0;
  pTVar1 = (ThreadPool *)local_9d;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1f3bca);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8,
             &in_stack_fffffffffffffdf0->severity_,in_stack_fffffffffffffde8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1f3bf8);
  __args_1 = (vector<float,_std::allocator<float>_> **)
             (in_RDI->_M_bound_args).
             super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
             .
             super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
             .super__Tuple_impl<2UL,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<3UL,_unsigned_int_*,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<4UL,_unsigned_long,_unsigned_long>.
             super__Head_base<4UL,_unsigned_long,_false>._M_head_impl;
  local_bd._1_4_ = 0;
  __args = (vector<float,_std::allocator<float>_> **)local_bd;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1f3c26);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8,
             &in_stack_fffffffffffffdf0->severity_,in_stack_fffffffffffffde8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1f3c54);
  for (local_c4 = 0;
      (ulong)(long)local_c4 <
      (in_RDI->_M_bound_args).
      super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
      .
      super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
      .super__Tuple_impl<2UL,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<3UL,_unsigned_int_*,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<4UL,_unsigned_long,_unsigned_long>.
      super__Head_base<4UL,_unsigned_long,_false>._M_head_impl; local_c4 = local_c4 + 1) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_1c._4_8_);
    getStart(sVar3,(in_RDI->_M_bound_args).
                   super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                   .
                   super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                   .
                   super__Tuple_impl<2UL,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                   .super__Tuple_impl<3UL,_unsigned_int_*,_unsigned_long,_unsigned_long>.
                   super__Tuple_impl<4UL,_unsigned_long,_unsigned_long>.
                   super__Head_base<4UL,_unsigned_long,_false>._M_head_impl,(long)local_c4);
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_1c._4_8_);
    getEnd(sVar3,(in_RDI->_M_bound_args).
                 super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                 .
                 super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                 .
                 super__Tuple_impl<2UL,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                 .super__Tuple_impl<3UL,_unsigned_int_*,_unsigned_long,_unsigned_long>.
                 super__Tuple_impl<4UL,_unsigned_long,_unsigned_long>.
                 super__Head_base<4UL,_unsigned_long,_false>._M_head_impl,(long)local_c4);
    __args_2._M_head_impl =
         (in_RDI->_M_bound_args).
         super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
         .
         super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
         .super__Tuple_impl<2UL,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>.
         super__Tuple_impl<3UL,_unsigned_int_*,_unsigned_long,_unsigned_long>.
         super__Tuple_impl<4UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<5UL,_unsigned_long>.
         super__Head_base<5UL,_unsigned_long,_false>._M_head_impl;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_9d + 5),(long)local_c4)
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_bd + 5),(long)local_c4)
    ;
    std::
    bind<void(&)(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_int*,unsigned_long,unsigned_long),std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_int*,unsigned_long&,unsigned_long&>
              (__f,__args,__args_1,(uint **)__args_2._M_head_impl,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
    ThreadPool::
    enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_int*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_int*,unsigned_long,unsigned_long)>>
              (this_00,in_RDI);
    std::future<void>::~future((future<void> *)0x1f3dc2);
  }
  ThreadPool::Sync(pTVar1,(int)((ulong)__f >> 0x20));
  local_148 = 0;
  while( true ) {
    sVar3 = local_148;
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_9d + 5));
    if (sVar4 <= sVar3) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_9d + 5),
                        local_148);
    *(value_type *)
     &(in_RDI->_M_bound_args).
      super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
      .
      super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
      .super__Tuple_impl<2UL,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<3UL,_unsigned_int_*,_unsigned_long,_unsigned_long>.
      super__Head_base<3UL,_unsigned_int_*,_false>._M_head_impl =
         *pvVar5 + *(int *)&(in_RDI->_M_bound_args).
                            super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                            .
                            super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                            .
                            super__Tuple_impl<2UL,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                            .super__Tuple_impl<3UL,_unsigned_int_*,_unsigned_long,_unsigned_long>.
                            super__Head_base<3UL,_unsigned_int_*,_false>._M_head_impl;
    local_148 = local_148 + 1;
  }
  local_150 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  while( true ) {
    this_01 = local_150;
    pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_bd + 5));
    if (pvVar6 <= this_01) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_bd + 5),
                        (size_type)local_150);
    *(value_type *)
     ((long)&(in_RDI->_M_bound_args).
             super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
             .
             super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
             .super__Tuple_impl<2UL,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<3UL,_unsigned_int_*,_unsigned_long,_unsigned_long>.
             super__Head_base<3UL,_unsigned_int_*,_false>._M_head_impl + 4) =
         *pvVar5 + *(int *)((long)&(in_RDI->_M_bound_args).
                                   super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                                   .
                                   super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                                   .
                                   super__Tuple_impl<2UL,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long>
                                   .
                                   super__Tuple_impl<3UL,_unsigned_int_*,_unsigned_long,_unsigned_long>
                                   .super__Head_base<3UL,_unsigned_int_*,_false>._M_head_impl + 4);
    local_150 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                ((long)&(local_150->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_01);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_01);
  return;
}

Assistant:

void Accumulate(const std::vector<real_t>& Y,
                  const std::vector<real_t>& pred) {
    CHECK_EQ(Y.size(), pred.size());
    // multi-thread training
    std::vector<index_t> sum_1(threadNumber_, 0);
    std::vector<index_t> sum_2(threadNumber_, 0);
    for (int i = 0; i < threadNumber_; ++i) {
      size_t start_idx = getStart(pred.size(), threadNumber_, i);
      size_t end_idx = getEnd(pred.size(), threadNumber_, i);
      pool_->enqueue(std::bind(recall_accum_thread,
                               &Y,
                               &pred,
                               &(sum_1[i]),
                               &(sum_2[i]),
                               start_idx,
                               end_idx));
    }
    // Wait all of the threads finish their job
    pool_->Sync(threadNumber_);
    for (size_t i = 0; i < sum_1.size(); ++i) {
      true_positive_ += sum_1[i];
    }
    for (size_t i = 0; i < sum_2.size(); ++i) {
      false_negative_ += sum_2[i];
    }
  }